

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ags.cpp
# Opt level: O2

bool dxil_spv::emit_wmma_store(Impl *impl)

{
  uint uVar1;
  bool bVar2;
  Id IVar3;
  Builder *this;
  Value *pVVar4;
  Value *stride;
  Operation *this_00;
  bool bVar5;
  WMMAAccessChain WVar6;
  
  this = Converter::Impl::builder(impl);
  pVVar4 = LLVMBC::Instruction::getOperand
                     (&(impl->ags).backdoor_instructions[5]->super_Instruction,5);
  bVar5 = false;
  if (((pVVar4 == (impl->ags).active_read_backdoor) &&
      (bVar5 = false, (impl->ags).instructions[0].phase == 0)) &&
     ((impl->ags).instructions[5].phase == 2)) {
    bVar5 = false;
    bVar2 = validate_wmma_io_registers
                      (impl,1,AmdExtD3DShaderIntrinsicsWaveMatrixRegType_RetVal_Reg,1,true);
    if (bVar2) {
      uVar1 = (impl->ags).instructions[5].immediate;
      pVVar4 = LLVMBC::Instruction::getOperand
                         (&(impl->ags).backdoor_instructions[0]->super_Instruction,5);
      stride = LLVMBC::Instruction::getOperand
                         (&(impl->ags).backdoor_instructions[0]->super_Instruction,6);
      WVar6 = build_wmma_access_chain(impl,pVVar4,stride);
      if (WVar6.chain_id == 0) {
        bVar5 = false;
      }
      else {
        this_00 = Converter::Impl::allocate(impl,OpCooperativeMatrixStoreKHR);
        Operation::add_id(this_00,WVar6.chain_id);
        pVVar4 = LLVMBC::Instruction::getOperand
                           (&(impl->ags).backdoor_instructions[1]->super_Instruction,5);
        IVar3 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
        Operation::add_id(this_00,IVar3);
        IVar3 = spv::Builder::makeUintConstant(this,uVar1 >> 7 & 1,false);
        Operation::add_id(this_00,IVar3);
        Operation::add_id(this_00,WVar6.stride_id);
        if (WVar6.alignment != 0) {
          Operation::add_literal(this_00,2);
          Operation::add_literal(this_00,WVar6.alignment);
        }
        Converter::Impl::add(impl,this_00,false);
        bVar5 = true;
      }
    }
  }
  return bVar5;
}

Assistant:

static bool emit_wmma_store(Converter::Impl &impl)
{
	auto &builder = impl.builder();

	// Sanity check that we're reading from the hooked read opcode.
	if (impl.ags.backdoor_instructions[5]->getOperand(5) != impl.ags.active_read_backdoor)
		return false;

	if (impl.ags.instructions[0].phase != 0)
		return false;
	if (impl.ags.instructions[5].phase != 2)
		return false;

	if (!validate_wmma_io_registers(impl, 1, AmdExtD3DShaderIntrinsicsWaveMatrixRegType_RetVal_Reg, 1, true))
		return false;

	uint32_t type_immediate = impl.ags.instructions[5].immediate;
	bool column_major = ((type_immediate >> AmdExtD3DShaderIntrinsicsWaveMatrixModifier_LayoutFlagShift) &
	                     AmdExtD3DShaderIntrinsicsWaveMatrixModifier_LayoutFlagMask) != 0;

	auto chain = build_wmma_access_chain(impl, impl.ags.backdoor_instructions[0]->getOperand(5),
	                                     impl.ags.backdoor_instructions[0]->getOperand(6));

	if (chain.chain_id == 0)
		return false;

	auto *store = impl.allocate(spv::OpCooperativeMatrixStoreKHR);
	store->add_id(chain.chain_id);
	store->add_id(impl.get_id_for_value(impl.ags.backdoor_instructions[1]->getOperand(5)));
	store->add_id(builder.makeUintConstant(
		column_major ? spv::CooperativeMatrixLayoutColumnMajorKHR : spv::CooperativeMatrixLayoutRowMajorKHR));
	store->add_id(chain.stride_id);

	if (chain.alignment)
	{
		store->add_literal(spv::MemoryAccessAlignedMask);
		store->add_literal(chain.alignment);
	}

	impl.add(store);

	return true;
}